

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack4.h
# Opt level: O0

void ncnn::conv3x3s1_winograd43_transform_kernel_pack4_sse
               (Mat *kernel,Mat *kernel_tm_pack4,int inch,int outch,Option *opt)

{
  int in_ECX;
  long lVar1;
  int in_EDX;
  long *in_RSI;
  long *in_RDI;
  float *k00;
  int j_1;
  int i_2;
  int p_1;
  float *g00;
  int k;
  Mat g0;
  int q_1;
  int i_1;
  float *tmpp;
  int j;
  int i;
  float tmp [6] [3];
  float *k2;
  float *k1;
  float *k0;
  float *kernel_tm0;
  float *kernel0;
  int q;
  int p;
  float ktm [6] [3];
  Mat kernel_tm;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Allocator *in_stack_fffffffffffffa80;
  int _elempack;
  Allocator *pAVar2;
  size_t in_stack_fffffffffffffa88;
  undefined8 in_stack_fffffffffffffa90;
  int _c;
  undefined8 in_stack_fffffffffffffa98;
  Mat *in_stack_fffffffffffffaa0;
  undefined8 local_4f8;
  undefined8 local_4f0;
  undefined8 local_4e8;
  undefined4 local_4e0;
  long *local_4d8;
  undefined4 local_4d0;
  undefined4 local_4cc;
  undefined4 local_4c8;
  undefined4 local_4c4;
  undefined4 local_4c0;
  undefined8 local_4b8;
  _func_int **local_4b0;
  int local_4a4;
  int local_4a0;
  int local_49c;
  undefined4 *local_498;
  int local_48c;
  undefined8 local_488;
  undefined8 local_480;
  undefined8 local_478;
  undefined4 local_470;
  long local_468;
  undefined4 local_460;
  undefined4 local_45c;
  undefined4 local_458;
  undefined4 local_454;
  undefined4 local_450;
  undefined8 local_448;
  int local_440;
  int local_43c;
  float *local_438;
  int local_430;
  int local_42c;
  float local_428 [18];
  float *local_3e0;
  float *local_3d8;
  float *local_3d0;
  undefined8 local_3c8;
  undefined8 local_3c0;
  undefined8 local_3b8;
  undefined4 local_3b0;
  long *local_3a8;
  undefined4 local_3a0;
  undefined4 local_39c;
  undefined4 local_398;
  undefined4 local_394;
  undefined4 local_390;
  undefined8 local_388;
  _func_int **local_380;
  float *local_368;
  int local_360;
  int local_35c;
  float local_358 [20];
  Allocator local_308;
  int *local_300;
  long local_2f8;
  undefined4 local_2f0;
  long *local_2e8;
  undefined4 local_2e0;
  int local_2dc;
  int local_2d8;
  undefined4 local_2d4;
  undefined4 local_2d0;
  long local_2c8;
  int local_2b8;
  int local_2b4;
  long *local_2b0;
  long *local_2a8;
  undefined8 *local_2a0;
  undefined8 *local_298;
  undefined8 *local_290;
  Allocator *local_280;
  int local_260;
  undefined4 local_25c;
  Allocator *local_258;
  undefined8 *local_238;
  undefined8 *local_228;
  undefined8 *local_218;
  undefined1 local_20d;
  int local_20c;
  Allocator *local_208;
  undefined8 *local_200;
  undefined1 local_1dd;
  int local_1dc;
  undefined8 *local_1d0;
  undefined1 local_1ad;
  int local_1ac;
  Allocator *local_1a8;
  undefined8 *local_1a0;
  _func_int **local_140;
  int local_12c;
  undefined8 *local_128;
  int local_11c;
  undefined8 *local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined4 local_f4;
  Allocator *local_f0;
  int local_e4;
  undefined8 *local_e0;
  long *local_d8;
  undefined4 local_cc;
  long local_c8;
  _func_int **local_c0;
  undefined4 local_b4;
  int local_b0;
  int local_ac;
  undefined8 *local_a8;
  long local_a0;
  undefined4 local_94;
  long local_90;
  long local_88;
  undefined4 local_7c;
  int local_78;
  int local_74;
  undefined8 *local_70;
  long *local_68;
  undefined4 local_5c;
  long local_58;
  _func_int **local_50;
  undefined4 local_44;
  int local_40;
  int local_3c;
  undefined8 *local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  _c = (int)((ulong)in_stack_fffffffffffffa90 >> 0x20);
  pAVar2 = &local_308;
  local_f4 = 0x24;
  local_108 = 4;
  local_110 = 0;
  local_308._vptr_Allocator = (_func_int **)0x0;
  local_300 = (int *)0x0;
  local_2f8 = 0;
  local_2f0 = 0;
  local_2e8 = (long *)0x0;
  local_2e0 = 0;
  local_2dc = 0;
  local_2d8 = 0;
  local_2d4 = 0;
  local_2d0 = 0;
  local_2c8 = 0;
  local_2b8 = in_ECX;
  local_2b4 = in_EDX;
  local_2b0 = in_RSI;
  local_2a8 = in_RDI;
  local_f0 = pAVar2;
  Mat::create(in_stack_fffffffffffffaa0,(int)((ulong)in_stack_fffffffffffffa98 >> 0x20),
              (int)in_stack_fffffffffffffa98,_c,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80)
  ;
  _elempack = (int)((ulong)in_stack_fffffffffffffa80 >> 0x20);
  memcpy(local_358,&DAT_01f06380,0x48);
  for (local_35c = 0; local_35c < local_2b8; local_35c = local_35c + 1) {
    for (local_360 = 0; local_360 < local_2b4; local_360 = local_360 + 1) {
      local_3d0 = (float *)(*local_2a8 + (long)(local_35c * local_2b4 * 9) * 4 +
                           (long)(local_360 * 9) * 4);
      local_1a0 = &local_3c8;
      local_1a8 = &local_308;
      local_c0 = local_308._vptr_Allocator + local_2c8 * local_35c * local_2f8;
      local_a8 = &local_3c8;
      local_8 = (long)local_2dc * (long)local_2d8 * local_2f8;
      local_3a8 = local_2e8;
      local_c = 0x10;
      local_ac = local_2dc;
      local_b0 = local_2d8;
      local_b4 = local_2d4;
      local_c8 = local_2f8;
      local_cc = local_2f0;
      local_d8 = local_2e8;
      local_1ac = local_35c;
      local_1ad = 1;
      local_118 = &local_3c8;
      local_11c = local_360;
      local_380 = (_func_int **)((long)local_c0 + (long)local_2dc * (long)local_360 * local_2f8);
      local_2a0 = &local_3c8;
      local_3c8 = 0;
      local_3b8 = 0;
      local_3b0 = 0;
      local_3a0 = 0;
      local_39c = 0;
      local_398 = 0;
      local_394 = 0;
      local_390 = 0;
      local_388 = 0;
      local_3c0 = 0;
      local_3d8 = local_3d0 + 3;
      local_3e0 = local_3d0 + 6;
      for (local_42c = 0; local_42c < 6; local_42c = local_42c + 1) {
        local_428[(long)local_42c * 3] =
             *local_3d0 * local_358[(long)local_42c * 3] +
             local_3d0[1] * local_358[(long)local_42c * 3 + 1] +
             local_3d0[2] * local_358[(long)local_42c * 3 + 2];
        local_428[(long)local_42c * 3 + 1] =
             *local_3d8 * local_358[(long)local_42c * 3] +
             local_3d0[4] * local_358[(long)local_42c * 3 + 1] +
             local_3d0[5] * local_358[(long)local_42c * 3 + 2];
        local_428[(long)local_42c * 3 + 2] =
             *local_3e0 * local_358[(long)local_42c * 3] +
             local_3d0[7] * local_358[(long)local_42c * 3 + 1] +
             local_3d0[8] * local_358[(long)local_42c * 3 + 2];
      }
      for (local_430 = 0; local_430 < 6; local_430 = local_430 + 1) {
        lVar1 = (long)local_430;
        local_438 = local_428 + lVar1 * 3;
        for (local_43c = 0; local_43c < 6; local_43c = local_43c + 1) {
          *(float *)((long)local_380 + (long)(local_430 * 6 + local_43c) * 4) =
               *local_438 * local_358[(long)local_43c * 3] +
               local_428[lVar1 * 3 + 1] * local_358[(long)local_43c * 3 + 1] +
               local_428[lVar1 * 3 + 2] * local_358[(long)local_43c * 3 + 2];
        }
      }
      local_368 = local_3d0;
      local_218 = local_2a0;
    }
  }
  Mat::create(in_stack_fffffffffffffaa0,(int)((ulong)in_stack_fffffffffffffa98 >> 0x20),
              (int)in_stack_fffffffffffffa98,_c,in_stack_fffffffffffffa88,_elempack,pAVar2);
  for (local_440 = 0; local_440 + 3 < local_2b8; local_440 = local_440 + 4) {
    local_1dc = local_440 / 4;
    local_1d0 = &local_488;
    local_74 = *(int *)((long)local_2b0 + 0x2c);
    local_78 = (int)local_2b0[6];
    local_7c = *(undefined4 *)((long)local_2b0 + 0x34);
    local_88 = *local_2b0 + local_2b0[8] * (long)local_1dc * local_2b0[2];
    local_90 = local_2b0[2];
    local_94 = (undefined4)local_2b0[3];
    local_a0 = local_2b0[4];
    local_70 = &local_488;
    local_18 = (long)local_74 * (long)local_78 * local_90;
    for (local_48c = 0; local_48c < 0x24; local_48c = local_48c + 1) {
      local_e0 = &local_488;
      local_e4 = local_48c;
      local_498 = (undefined4 *)(local_88 + (long)local_74 * (long)local_48c * local_90);
      for (local_49c = 0; local_49c + 3 < local_2b4; local_49c = local_49c + 4) {
        for (local_4a0 = 0; local_4a0 < 4; local_4a0 = local_4a0 + 1) {
          for (local_4a4 = 0; local_4a4 < 4; local_4a4 = local_4a4 + 1) {
            local_20c = local_440 + local_4a4;
            local_200 = &local_4f8;
            local_208 = &local_308;
            local_50 = local_308._vptr_Allocator + local_2c8 * local_20c * local_2f8;
            local_38 = &local_4f8;
            local_28 = (long)local_2dc * (long)local_2d8 * local_2f8;
            local_12c = local_49c + local_4a0;
            local_128 = &local_4f8;
            local_4b0 = (_func_int **)
                        ((long)local_50 + (long)local_2dc * (long)local_12c * local_2f8);
            local_298 = &local_4f8;
            local_4d8 = local_2e8;
            local_2c = 0x10;
            local_3c = local_2dc;
            local_40 = local_2d8;
            local_44 = local_2d4;
            local_58 = local_2f8;
            local_5c = local_2f0;
            local_68 = local_2e8;
            local_20d = 1;
            local_4f8 = 0;
            local_4e8 = 0;
            local_4e0 = 0;
            local_4d0 = 0;
            local_4cc = 0;
            local_4c8 = 0;
            local_4c4 = 0;
            local_4c0 = 0;
            local_4b8 = 0;
            local_4f0 = 0;
            *local_498 = *(undefined4 *)((long)local_4b0 + (long)local_48c * 4);
            local_498 = local_498 + 1;
            local_228 = local_298;
          }
        }
      }
    }
    local_290 = &local_488;
    local_1c = 0x10;
    local_1dd = 1;
    local_488 = 0;
    local_478 = 0;
    local_470 = 0;
    local_460 = 0;
    local_45c = 0;
    local_458 = 0;
    local_454 = 0;
    local_450 = 0;
    local_448 = 0;
    local_480 = 0;
    local_238 = local_290;
    local_468 = local_a0;
  }
  pAVar2 = &local_308;
  if (local_300 != (int *)0x0) {
    local_25c = 0xffffffff;
    LOCK();
    local_260 = *local_300;
    *local_300 = *local_300 + -1;
    UNLOCK();
    if (local_260 == 1) {
      local_280 = pAVar2;
      local_258 = pAVar2;
      if (local_2e8 == (long *)0x0) {
        local_140 = local_308._vptr_Allocator;
        if (local_308._vptr_Allocator != (_func_int **)0x0) {
          free(local_308._vptr_Allocator);
        }
      }
      else {
        (**(code **)(*local_2e8 + 0x18))(local_2e8,local_308._vptr_Allocator);
      }
    }
  }
  pAVar2->_vptr_Allocator = (_func_int **)0x0;
  pAVar2[2]._vptr_Allocator = (_func_int **)0x0;
  *(undefined4 *)&pAVar2[3]._vptr_Allocator = 0;
  *(undefined4 *)&pAVar2[5]._vptr_Allocator = 0;
  *(undefined4 *)((long)&pAVar2[5]._vptr_Allocator + 4) = 0;
  *(undefined4 *)&pAVar2[6]._vptr_Allocator = 0;
  *(undefined4 *)((long)&pAVar2[6]._vptr_Allocator + 4) = 0;
  *(undefined4 *)&pAVar2[7]._vptr_Allocator = 0;
  pAVar2[8]._vptr_Allocator = (_func_int **)0x0;
  pAVar2[1]._vptr_Allocator = (_func_int **)0x0;
  return;
}

Assistant:

static void conv3x3s1_winograd43_transform_kernel_pack4_sse(const Mat& kernel, Mat& kernel_tm_pack4, int inch, int outch, const Option& opt)
{
    // winograd43 transform kernel
    Mat kernel_tm(6 * 6, inch, outch);

    const float ktm[6][3] = {
        {1.0f / 4, 0.0f, 0.0f},
        {-1.0f / 6, -1.0f / 6, -1.0f / 6},
        {-1.0f / 6, 1.0f / 6, -1.0f / 6},
        {1.0f / 24, 1.0f / 12, 1.0f / 6},
        {1.0f / 24, -1.0f / 12, 1.0f / 6},
        {0.0f, 0.0f, 1.0f}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const float* kernel0 = (const float*)kernel + p * inch * 9 + q * 9;
            float* kernel_tm0 = kernel_tm.channel(p).row(q);

            // transform kernel
            const float* k0 = kernel0;
            const float* k1 = kernel0 + 3;
            const float* k2 = kernel0 + 6;

            // h
            float tmp[6][3];
            for (int i = 0; i < 6; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // U
            for (int j = 0; j < 6; j++)
            {
                float* tmpp = &tmp[j][0];

                for (int i = 0; i < 6; i++)
                {
                    kernel_tm0[j * 6 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }

    // interleave
    // src = 36-inch-outch
    // dst = pb-pa-inch/pa-36-outch/pb
    kernel_tm_pack4.create(inch / 4, 36, outch / 4, (size_t)4u * 4 * 4, 4 * 4);

    for (int q = 0; q + 3 < outch; q += 4)
    {
        Mat g0 = kernel_tm_pack4.channel(q / 4);

        for (int k = 0; k < 36; k++)
        {
            float* g00 = g0.row<float>(k);

            for (int p = 0; p + 3 < inch; p += 4)
            {
                for (int i = 0; i < 4; i++)
                {
                    for (int j = 0; j < 4; j++)
                    {
                        const float* k00 = kernel_tm.channel(q + j).row(p + i);
                        g00[0] = k00[k];
                        g00++;
                    }
                }
            }
        }
    }
}